

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O0

void __thiscall
spvtools::opt::VectorDCE::AddItemToWorkListIfNeeded
          (VectorDCE *this,WorkListItem *work_item,LiveComponentMap *live_components,
          vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
          *work_list)

{
  bool bVar1;
  pointer ppVar2;
  uint32_t local_6c;
  pair<unsigned_int,_spvtools::utils::BitVector> local_68;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_false> local_48;
  uint32_t local_3c;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_false> local_38;
  iterator it;
  Instruction *current_inst;
  vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  *work_list_local;
  LiveComponentMap *live_components_local;
  WorkListItem *work_item_local;
  VectorDCE *this_local;
  
  it.super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_false>)
           work_item->instruction;
  local_3c = Instruction::result_id
                       ((Instruction *)
                        it.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_false>
                        ._M_cur);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::utils::BitVector,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::utils::BitVector>_>_>
       ::find(live_components,&local_3c);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::utils::BitVector,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::utils::BitVector>_>_>
       ::end(live_components);
  bVar1 = std::__detail::operator==(&local_38,&local_48);
  if (bVar1) {
    local_6c = Instruction::result_id
                         ((Instruction *)
                          it.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_false>
                          ._M_cur);
    std::make_pair<unsigned_int,spvtools::utils::BitVector&>
              (&local_68,&local_6c,&work_item->components);
    std::
    unordered_map<unsigned_int,spvtools::utils::BitVector,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::utils::BitVector>>>
    ::emplace<std::pair<unsigned_int,spvtools::utils::BitVector>>
              ((unordered_map<unsigned_int,spvtools::utils::BitVector,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::utils::BitVector>>>
                *)live_components,&local_68);
    std::pair<unsigned_int,_spvtools::utils::BitVector>::~pair(&local_68);
    std::
    vector<spvtools::opt::VectorDCE::WorkListItem,std::allocator<spvtools::opt::VectorDCE::WorkListItem>>
    ::emplace_back<spvtools::opt::VectorDCE::WorkListItem&>
              ((vector<spvtools::opt::VectorDCE::WorkListItem,std::allocator<spvtools::opt::VectorDCE::WorkListItem>>
                *)work_list,work_item);
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_false,_false>
                           *)&local_38);
    bVar1 = utils::BitVector::Or(&ppVar2->second,&work_item->components);
    if (bVar1) {
      std::
      vector<spvtools::opt::VectorDCE::WorkListItem,std::allocator<spvtools::opt::VectorDCE::WorkListItem>>
      ::emplace_back<spvtools::opt::VectorDCE::WorkListItem&>
                ((vector<spvtools::opt::VectorDCE::WorkListItem,std::allocator<spvtools::opt::VectorDCE::WorkListItem>>
                  *)work_list,work_item);
    }
  }
  return;
}

Assistant:

void VectorDCE::AddItemToWorkListIfNeeded(
    WorkListItem work_item, VectorDCE::LiveComponentMap* live_components,
    std::vector<WorkListItem>* work_list) {
  Instruction* current_inst = work_item.instruction;
  auto it = live_components->find(current_inst->result_id());
  if (it == live_components->end()) {
    live_components->emplace(
        std::make_pair(current_inst->result_id(), work_item.components));
    work_list->emplace_back(work_item);
  } else {
    if (it->second.Or(work_item.components)) {
      work_list->emplace_back(work_item);
    }
  }
}